

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

void Nwk_NodeUpdateArrival(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *vQueue;
  Nwk_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void **__ptr;
  ulong uVar6;
  long lVar7;
  Nwk_Obj_t *pObj_01;
  ulong uVar8;
  long lVar9;
  float fVar10;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x23a,"void Nwk_NodeUpdateArrival(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  vQueue = pObj->pMan->vTemp;
  fVar10 = Nwk_NodeComputeArrival(pObj,1);
  if (pObj->tRequired + 0.01 <= fVar10) {
    __assert_fail("Nwk_ManTimeLess( tArrival, Nwk_ObjRequired(pObj), (float)0.01 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x23d,"void Nwk_NodeUpdateArrival(Nwk_Obj_t *)");
  }
  vQueue->nSize = 0;
  iVar2 = 0;
  __ptr = vQueue->pArray;
  if (vQueue->nCap == 0) {
    if (__ptr == (void **)0x0) {
      __ptr = (void **)malloc(0x80);
      iVar2 = 0;
    }
    else {
      __ptr = (void **)realloc(__ptr,0x80);
      iVar2 = vQueue->nSize;
    }
    vQueue->pArray = __ptr;
    vQueue->nCap = 0x10;
  }
  vQueue->nSize = iVar2 + 1;
  __ptr[iVar2] = pObj;
  pObj->field_0x20 = pObj->field_0x20 | 0x10;
  if (p != (Tim_Man_t *)0x0) {
    Tim_ManIncrementTravId(p);
  }
  if (0 < vQueue->nSize) {
    lVar9 = 0;
    pObj_01 = (Nwk_Obj_t *)0x0;
    do {
      pObj_00 = (Nwk_Obj_t *)vQueue->pArray[lVar9];
      *(uint *)&pObj_00->field_0x20 = *(uint *)&pObj_00->field_0x20 & 0xffffffef;
      fVar10 = Nwk_NodeComputeArrival(pObj_00,1);
      if ((p != (Tim_Man_t *)0x0) && ((*(uint *)&pObj_00->field_0x20 & 7) == 1)) {
        fVar10 = Tim_ManGetCiArrival(p,*(uint *)&pObj_00->field_0x20 >> 7);
      }
      if ((fVar10 + 0.01 <= pObj_00->tArrival) || (pObj_00->tArrival + 0.01 <= fVar10)) {
        pObj_00->tArrival = fVar10;
        if ((*(uint *)&pObj_00->field_0x20 & 7) == 2) {
          if ((p != (Tim_Man_t *)0x0) &&
             (iVar2 = Tim_ManBoxForCo(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iVar2)) {
            iVar3 = Tim_ManIsCoTravIdCurrent(p,*(uint *)&pObj_00->field_0x20 >> 7);
            if (iVar3 != 0) {
              Tim_ManSetPreviousTravIdBoxInputs(p,iVar2);
            }
            Tim_ManSetCoArrival(p,*(uint *)&pObj_00->field_0x20 >> 7,fVar10);
            Tim_ManSetCurrentTravIdBoxInputs(p,iVar2);
            uVar4 = Tim_ManBoxOutputFirst(p,iVar2);
            uVar5 = Tim_ManBoxOutputNum(p,iVar2);
            if (0 < (int)uVar5) {
              uVar6 = (ulong)uVar4;
              uVar8 = (ulong)uVar5;
              do {
                if (((int)uVar4 < 0) || (pVVar1 = pObj_01->pMan->vCis, pVVar1->nSize <= (int)uVar6))
                {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pObj_01 = (Nwk_Obj_t *)pVVar1->pArray[uVar6];
                if ((pObj_01->field_0x20 & 0x10) == 0) {
                  Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar9,1);
                  pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                }
                uVar6 = uVar6 + 1;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
          }
        }
        else {
          iVar2 = pObj_00->nFanouts;
          if (0 < iVar2) {
            lVar7 = 0;
            do {
              pObj_01 = pObj_00->pFanio[pObj_00->nFanins + lVar7];
              if (pObj_01 == (Nwk_Obj_t *)0x0) {
                pObj_01 = (Nwk_Obj_t *)0x0;
                break;
              }
              if ((pObj_01->field_0x20 & 0x10) == 0) {
                Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar9,1);
                pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                iVar2 = pObj_00->nFanouts;
              }
              lVar7 = lVar7 + 1;
            } while ((int)lVar7 < iVar2);
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vQueue->nSize);
  }
  return;
}

Assistant:

void Nwk_NodeUpdateArrival( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    float tArrival;
    int iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // verify the arrival time
    tArrival = Nwk_NodeComputeArrival( pObj, 1 );
    assert( Nwk_ManTimeLess( tArrival, Nwk_ObjRequired(pObj), (float)0.01 ) );
    // initialize the queue with the node
    Vec_PtrClear( vQueue );
    Vec_PtrPush( vQueue, pObj );
    pObj->MarkA = 1;
    // process objects
    if ( pManTime )
        Tim_ManIncrementTravId( pManTime );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        tArrival = Nwk_NodeComputeArrival( pTemp, 1 );
        if ( Nwk_ObjIsCi(pTemp) && pManTime )
            tArrival = Tim_ManGetCiArrival( pManTime, pTemp->PioId );
        if ( Nwk_ManTimeEqual( tArrival, Nwk_ObjArrival(pTemp), (float)0.01 ) )
            continue;
        Nwk_ObjSetArrival( pTemp, tArrival );
        // add the fanouts to the queue
        if ( Nwk_ObjIsCo(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCo( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this CO is an input of the box
                {
                    // it may happen that a box-input (CO) was already marked as visited
                    // when some other box-input of the same box was visited - here we undo this
                    if ( Tim_ManIsCoTravIdCurrent( pManTime, pTemp->PioId ) )
                        Tim_ManSetPreviousTravIdBoxInputs( pManTime, iBox );
                    Tim_ManSetCoArrival( pManTime, pTemp->PioId, tArrival );
                    Tim_ManSetCurrentTravIdBoxInputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxOutputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCi(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                pNext->MarkA = 1;
            }
        }
    }
}